

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O3

int Res_FilterCandidates
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax,int fArea)

{
  void **ppvVar1;
  void *pvVar2;
  void *Entry;
  byte bVar3;
  long lVar4;
  uint *puVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int Level;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  
  if (pSim->vOuts->nSize < 2) {
LAB_00487081:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar19 = (ulong)(uint)pSim->nWordsOut;
  while (0 < (int)uVar19) {
    lVar12 = uVar19 * 4;
    uVar19 = uVar19 - 1;
    if (*(int *)((long)pSim->vOuts->pArray[1] + lVar12 + -4) != -1) {
      return 0;
    }
  }
  puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
  uVar19 = (ulong)(uint)pSim->nWordsOut;
  while (0 < (int)uVar19) {
    lVar12 = uVar19 - 1;
    uVar19 = uVar19 - 1;
    if (puVar5[lVar12] != 0xffffffff) {
      return 0;
    }
  }
  iVar9 = vResubs->nSize;
  if (0 < (long)iVar9) {
    ppvVar1 = vResubs->pArray;
    lVar12 = 0;
    do {
      *(undefined4 *)((long)ppvVar1[lVar12] + 4) = 0;
      lVar12 = lVar12 + 1;
    } while (iVar9 != lVar12);
  }
  iVar9 = vResubsW->nSize;
  if (0 < (long)iVar9) {
    ppvVar1 = vResubsW->pArray;
    lVar12 = 0;
    do {
      *(undefined4 *)((long)ppvVar1[lVar12] + 4) = 0;
      lVar12 = lVar12 + 1;
    } while (iVar9 != lVar12);
  }
  pAVar6 = pWin->pNode;
  iVar9 = (pAVar6->vFanins).nSize;
  if (0 < iVar9) {
    lVar12 = 0;
    Level = 0;
LAB_0048679e:
    if ((fArea == 0) ||
       (*(int *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar12]] + 0x2c) < 2)) {
      bVar3 = (byte)lVar12 & 0x1f;
      puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      uVar19 = (ulong)(uint)pSim->nWordsOut;
      do {
        if ((int)uVar19 < 1) {
          if (pAig->vPos->nSize < 1) goto LAB_00487081;
          Vec_VecPush(vResubs,Level,*pAig->vPos->pArray);
          if (pAig->vPos->nSize < 2) goto LAB_00487081;
          Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
          pAVar6 = pWin->pNode;
          if ((pAVar6->vFanins).nSize < 1) goto LAB_004868b9;
          lVar16 = 0;
          goto LAB_0048684e;
        }
        lVar16 = uVar19 - 1;
        uVar19 = uVar19 - 1;
      } while (puVar5[lVar16] == 0xffffffff);
      pAVar6 = pWin->pNode;
    }
    goto LAB_004868ce;
  }
  Level = 0;
  goto LAB_00486b02;
LAB_0048684e:
  do {
    if (lVar12 != lVar16) {
      if (pAig->vPos->nSize <= (int)lVar16 + 2) goto LAB_00487081;
      pvVar2 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar16]];
      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[lVar16 + 2]);
      Vec_VecPush(vResubsW,Level,pvVar2);
      pAVar6 = pWin->pNode;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 < (pAVar6->vFanins).nSize);
LAB_004868b9:
  Level = Level + 1;
  if (Level == vResubs->nSize) {
    return Level;
  }
LAB_004868ce:
  lVar12 = lVar12 + 1;
  iVar9 = (pAVar6->vFanins).nSize;
  if (iVar9 <= lVar12) goto code_r0x004868de;
  goto LAB_0048679e;
code_r0x004868de:
  if (0 < iVar9) {
    lVar12 = 0;
LAB_004868e8:
    if (*(int *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar12]] + 0x2c) < 2) {
      bVar3 = (byte)lVar12 & 0x1f;
      puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      pAVar6 = pWin->pNode;
      iVar9 = (pAVar6->vFanins).nSize;
      uVar11 = iVar9 + 2;
      pVVar8 = pAig->vPos;
      if ((int)uVar11 < pVVar8->nSize) {
        uVar19 = (ulong)uVar11;
LAB_00486944:
        if (-3 < iVar9) {
          iVar18 = (int)uVar19;
          if (iVar18 < pSim->vOuts->nSize) {
            uVar11 = (iVar18 - (pWin->pNode->vFanins).nSize) - 2;
            uVar13 = (ulong)(uint)pSim->nWordsOut;
            do {
              if ((int)uVar13 < 1) {
                Vec_VecPush(vResubs,Level,*pVVar8->pArray);
                if (pAig->vPos->nSize < 2) goto LAB_00487081;
                Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
                pAVar6 = pWin->pNode;
                if ((pAVar6->vFanins).nSize < 1) goto LAB_00486a4c;
                lVar16 = 0;
                goto LAB_004869e3;
              }
              lVar16 = uVar13 * 4;
              lVar7 = uVar13 - 1;
              uVar13 = uVar13 - 1;
            } while ((*(uint *)((long)pSim->vOuts->pArray[uVar19] + lVar16 + -4) | puVar5[lVar7]) ==
                     0xffffffff);
            goto LAB_00486ac9;
          }
        }
        goto LAB_00487081;
      }
    }
    goto LAB_00486aea;
  }
LAB_00486b02:
  if (0 < iVar9 && iVar9 < nFaninsMax) {
    lVar12 = 0;
LAB_00486b16:
    if (*(int *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar12]] + 0x2c) < 2) {
      bVar3 = (byte)lVar12 & 0x1f;
      puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      pAVar6 = pWin->pNode;
      iVar9 = (pAVar6->vFanins).nSize;
      pVVar8 = pAig->vPos;
      iVar18 = pVVar8->nSize;
      if ((int)(iVar9 + 2U) < iVar18) {
        uVar13 = (ulong)(iVar9 + 3);
        uVar19 = (ulong)(iVar9 + 2U);
LAB_00486b83:
        if (-3 < iVar9) {
          iVar22 = (int)uVar19;
          if (iVar22 < pSim->vOuts->nSize) {
            iVar17 = (int)(uVar19 + 1);
            if (iVar17 < iVar18) {
              pvVar2 = pSim->vOuts->pArray[uVar19];
              uVar11 = (iVar22 - (pWin->pNode->vFanins).nSize) - 2;
              uVar20 = uVar13;
LAB_00486bdf:
              if (-1 < (int)uVar13) {
                iVar18 = (int)uVar20;
                if (iVar18 < pSim->vOuts->nSize) {
                  uVar10 = (iVar18 - (pWin->pNode->vFanins).nSize) - 2;
                  uVar14 = (ulong)(uint)pSim->nWordsOut;
                  do {
                    if ((int)uVar14 < 1) {
                      Vec_VecPush(vResubs,Level,*pVVar8->pArray);
                      if (pAig->vPos->nSize < 2) goto LAB_00487081;
                      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
                      pAVar6 = pWin->pNode;
                      if ((pAVar6->vFanins).nSize < 1) goto LAB_00486cf6;
                      lVar16 = 0;
                      goto LAB_00486c88;
                    }
                    lVar16 = uVar14 * 4;
                    lVar15 = uVar14 - 1;
                    lVar7 = uVar14 * 4;
                    uVar14 = uVar14 - 1;
                  } while ((*(uint *)((long)pvVar2 + lVar16 + -4) | puVar5[lVar15] |
                           *(uint *)((long)pSim->vOuts->pArray[uVar20] + lVar7 + -4)) == 0xffffffff)
                  ;
                  goto LAB_00486dcd;
                }
              }
              goto LAB_00487081;
            }
            goto LAB_00486df9;
          }
        }
        goto LAB_00487081;
      }
    }
    goto LAB_00486e17;
  }
LAB_00486e27:
  if ((fArea != 0) || (iVar9 = (pAVar6->vFanins).nSize, iVar9 < 1)) {
    return Level;
  }
  lVar16 = 1;
  lVar12 = 0;
LAB_00486e42:
  lVar15 = lVar12 + 1;
  lVar7 = (long)iVar9;
  if (lVar15 < lVar7) {
    lVar7 = lVar16;
LAB_00486e76:
    puVar5 = Res_FilterCollectFaninInfo
                       (pWin,pSim,~(1 << ((byte)lVar12 & 0x1f) | 1 << ((uint)lVar7 & 0x1f)));
    iVar9 = (pWin->pNode->vFanins).nSize;
    pVVar8 = pAig->vPos;
    if ((int)(iVar9 + 2U) < pVVar8->nSize) {
      uVar19 = (ulong)(iVar9 + 2U);
LAB_00486eb0:
      if (-3 < iVar9) {
        iVar18 = (int)uVar19;
        if (iVar18 < pSim->vOuts->nSize) {
          uVar11 = (iVar18 - (pWin->pNode->vFanins).nSize) - 2;
          uVar13 = (ulong)(uint)pSim->nWordsOut;
          do {
            if ((int)uVar13 < 1) {
              Vec_VecPush(vResubs,Level,*pVVar8->pArray);
              if (pAig->vPos->nSize < 2) goto LAB_00487081;
              Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
              pAVar6 = pWin->pNode;
              if ((pAVar6->vFanins).nSize < 1) goto LAB_00486fc7;
              lVar21 = 0;
              goto LAB_00486f4e;
            }
            lVar21 = uVar13 * 4;
            lVar4 = uVar13 - 1;
            uVar13 = uVar13 - 1;
          } while ((*(uint *)((long)pSim->vOuts->pArray[uVar19] + lVar21 + -4) | puVar5[lVar4]) ==
                   0xffffffff);
          goto LAB_00487039;
        }
      }
      goto LAB_00487081;
    }
    goto LAB_00487055;
  }
  goto LAB_00487070;
LAB_004869e3:
  do {
    if (lVar12 != lVar16) {
      if (pAig->vPos->nSize <= (int)lVar16 + 2) goto LAB_00487081;
      pvVar2 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar16]];
      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[lVar16 + 2]);
      Vec_VecPush(vResubsW,Level,pvVar2);
      pAVar6 = pWin->pNode;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 < (pAVar6->vFanins).nSize);
LAB_00486a4c:
  if (((pAig->vPos->nSize <= iVar18) ||
      (Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar19]), (int)uVar11 < 0)) ||
     (pWin->vDivs->nSize <= (int)uVar11)) goto LAB_00487081;
  Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar11]);
  Level = Level + 1;
  if (Level == vResubs->nSize) {
    return Level;
  }
  pVVar8 = pAig->vPos;
LAB_00486ac9:
  uVar19 = uVar19 + 1;
  if (pVVar8->nSize <= (int)uVar19) goto code_r0x00486ad6;
  goto LAB_00486944;
code_r0x00486ad6:
  pAVar6 = pWin->pNode;
LAB_00486aea:
  lVar12 = lVar12 + 1;
  iVar9 = (pAVar6->vFanins).nSize;
  if (iVar9 <= lVar12) goto LAB_00486b02;
  goto LAB_004868e8;
LAB_00486c88:
  do {
    if (lVar12 != lVar16) {
      if (pAig->vPos->nSize <= (int)lVar16 + 2) goto LAB_00487081;
      Entry = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar16]];
      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[lVar16 + 2]);
      Vec_VecPush(vResubsW,Level,Entry);
      pAVar6 = pWin->pNode;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 < (pAVar6->vFanins).nSize);
LAB_00486cf6:
  if (pAig->vPos->nSize <= iVar22) goto LAB_00487081;
  Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar19]);
  if (((pAig->vPos->nSize <= iVar18) ||
      (Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar20]), (int)uVar11 < 0)) ||
     ((pWin->vDivs->nSize <= (int)uVar11 ||
      ((Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar11]), (int)uVar10 < 0 ||
       (pWin->vDivs->nSize <= (int)uVar10)))))) goto LAB_00487081;
  Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar10]);
  Level = Level + 1;
  if (Level == vResubs->nSize) {
    return Level;
  }
  pVVar8 = pAig->vPos;
LAB_00486dcd:
  uVar20 = uVar20 + 1;
  if (pVVar8->nSize <= (int)uVar20) goto code_r0x00486dda;
  goto LAB_00486bdf;
code_r0x00486dda:
  iVar18 = pVVar8->nSize;
LAB_00486df9:
  uVar13 = uVar13 + 1;
  uVar19 = uVar19 + 1;
  if (iVar18 <= iVar17) goto code_r0x00486e09;
  goto LAB_00486b83;
code_r0x00486e09:
  pAVar6 = pWin->pNode;
LAB_00486e17:
  lVar12 = lVar12 + 1;
  if ((pAVar6->vFanins).nSize <= lVar12) goto LAB_00486e27;
  goto LAB_00486b16;
LAB_00486f4e:
  do {
    if (lVar7 != lVar21 && lVar12 != lVar21) {
      if (pAig->vPos->nSize <= (int)lVar21 + 2) goto LAB_00487081;
      pvVar2 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar21]];
      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[lVar21 + 2]);
      Vec_VecPush(vResubsW,Level,pvVar2);
      pAVar6 = pWin->pNode;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 < (pAVar6->vFanins).nSize);
LAB_00486fc7:
  if (((pAig->vPos->nSize <= iVar18) ||
      (Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar19]), (int)uVar11 < 0)) ||
     (pWin->vDivs->nSize <= (int)uVar11)) goto LAB_00487081;
  Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar11]);
  Level = Level + 1;
  if (Level == vResubs->nSize) {
    return Level;
  }
  pVVar8 = pAig->vPos;
LAB_00487039:
  uVar19 = uVar19 + 1;
  if (pVVar8->nSize <= (int)uVar19) goto code_r0x00487046;
  goto LAB_00486eb0;
code_r0x00487046:
  iVar9 = (pWin->pNode->vFanins).nSize;
LAB_00487055:
  lVar7 = lVar7 + 1;
  if (iVar9 <= (int)lVar7) goto code_r0x00487060;
  goto LAB_00486e76;
code_r0x00487060:
  lVar7 = (long)iVar9;
LAB_00487070:
  lVar16 = lVar16 + 1;
  lVar12 = lVar15;
  if (lVar7 <= lVar15) {
    return Level;
  }
  goto LAB_00486e42;
}

Assistant:

int Res_FilterCandidates( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax, int fArea )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFaninTemp;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, i, i2, d, d2, iDiv, iDiv2, k;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing each fanin
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( fArea && Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
        if ( RetValue )
        {
//            printf( "Node %4d. Candidate fanin %4d.\n", pWin->pNode->Id, pFanin->Id );
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;    
        }
    }

    // try replacing each critical fanin by a non-critical fanin
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        // go over the set of divisors
        for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
        {
            pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
            iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
            if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;           
        }
    }

    // consider the case when two fanins can be added instead of one
    if ( Abc_ObjFaninNum(pWin->pNode) < nFaninsMax )
    {
        // try to replace each critical fanin by two non-critical fanins
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            if ( Abc_ObjFanoutNum(pFanin) > 1 )
                continue;
            // get simulation info without this fanin
            pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
            // go over the set of divisors
            for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
            {
                pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                // go through the second divisor
                for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
                {
                    pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
                    iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }

    // try to replace two nets by one
    if ( !fArea )
    {
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            for ( i2 = i + 1; i2 < Abc_ObjFaninNum(pWin->pNode); i2++ )
            {
                pFanin2 = Abc_ObjFanin(pWin->pNode, i2);
                // get simulation info without these fanins
                pInfo = Res_FilterCollectFaninInfo( pWin, pSim, (~(1 << i)) & (~(1 << i2)) );
                // go over the set of divisors
                for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
                {
                    pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                    iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i && k != i2 )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }
    return Counter;
}